

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::handle_join_cluster_resp(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  raft_server *this_00;
  bool bVar5;
  string local_48;
  
  peVar1 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar5 = false;
    this_00 = this;
  }
  else {
    peVar2 = (resp->peer_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (raft_server *)
              (resp->peer_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    if (this_00 != (raft_server *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(this_00->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                 super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(this_00->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(this_00->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                 super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(this_00->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
    }
    bVar5 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == peVar2;
  }
  if (this_00 != (raft_server *)0x0 && peVar1 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (bVar5) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (resp->accepted_ == true) {
      if ((peVar3 != (element_type *)0x0) && (iVar4 = (*peVar3->_vptr_logger[7])(), 3 < iVar4)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_48,"new server (%d) confirms it will join, start syncing logs to it",
                   (ulong)(uint)((((this->srv_to_join_).
                                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar3->_vptr_logger[8])
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_cluster_resp",0xcb,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
      sync_log_to_new_srv(this,resp->next_idx_);
      return;
    }
    if (peVar3 == (element_type *)0x0) {
      return;
    }
    iVar4 = (*peVar3->_vptr_logger[7])();
    if (iVar4 < 3) {
      return;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_48,"new server (%d) cannot accept the invitation, give up",
               (ulong)(uint)((((this->srv_to_join_).
                               super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             ->config_).
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id_);
    (*peVar3->_vptr_logger[8])
              (peVar3,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
               ,"handle_join_cluster_resp",0xcf,&local_48);
  }
  else {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      return;
    }
    iVar4 = (*peVar3->_vptr_logger[7])();
    if (iVar4 < 3) {
      return;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_(&local_48,"no server to join, drop the message");
    (*peVar3->_vptr_logger[8])
              (peVar3,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
               ,"handle_join_cluster_resp",0xd2,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void raft_server::handle_join_cluster_resp(resp_msg& resp) {
    if (srv_to_join_ && srv_to_join_ == resp.get_peer()) {
        if (resp.get_accepted()) {
            p_in("new server (%d) confirms it will join, "
                 "start syncing logs to it", srv_to_join_->get_id());
            sync_log_to_new_srv(resp.get_next_idx());
        } else {
            p_wn("new server (%d) cannot accept the invitation, give up",
                 srv_to_join_->get_id());
        }
    } else {
        p_wn("no server to join, drop the message");
    }
}